

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O3

int loop(uchar *pattern,uchar *string,int maxstars)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  uchar *puVar7;
  byte *pbVar8;
  long lVar9;
  uchar *pp;
  uchar charset [271];
  byte local_168 [10];
  byte abStack_15e [6];
  byte *local_158;
  int local_14c;
  uchar local_148 [91];
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  uchar local_48;
  char local_47;
  char local_46;
  char local_45;
  char local_44;
  char local_43;
  char local_42;
  char local_41;
  char local_40;
  char local_3f;
  char local_3e;
  
  memset(local_148,0,0x10f);
  do {
    bVar5 = *pattern;
    if (bVar5 < 0x5b) {
      if (bVar5 == 0x3f) {
        if (*string == 0) {
          return 1;
        }
      }
      else {
        if (bVar5 == 0) {
          return (uint)(*string != 0);
        }
        if (bVar5 == 0x2a) {
          if (maxstars == 0) {
            return 1;
          }
          do {
            do {
              bVar5 = pattern[1];
              pattern = pattern + 1;
            } while (bVar5 == 0x2a);
            if (bVar5 == 0) {
              return 0;
            }
            if (bVar5 != 0x3f) {
              if (*string == 0) {
                return 1;
              }
              do {
                iVar2 = loop(pattern,string,maxstars + -1);
                if (iVar2 == 0) {
                  return 0;
                }
                pbVar4 = string + 1;
                string = string + 1;
              } while (*pbVar4 != 0);
              return 1;
            }
            bVar5 = *string;
            string = string + 1;
          } while (bVar5 != 0);
          return 1;
        }
LAB_001257e1:
        if (bVar5 != *string) {
          return 1;
        }
      }
      pattern = pattern + 1;
    }
    else if (bVar5 == 0x5b) {
      local_158 = pattern + 1;
      memset(local_148,0,0x10f);
      bVar5 = pattern[1];
      if (bVar5 == 0) {
        return 1;
      }
      bVar1 = false;
      iVar2 = 0;
      pbVar4 = pattern + 1;
      while( true ) {
        if (iVar2 == 2) {
          if (bVar5 != 0x5d) {
            local_148[bVar5] = '\x01';
            goto LAB_00125609;
          }
          goto LAB_001257f5;
        }
        if (iVar2 == 1) break;
        if (iVar2 != 0) goto LAB_001257b1;
        switch(bVar5) {
        case 0x5b:
          if (pbVar4[1] == 0x3a) {
            pbVar8 = pbVar4 + 3;
            bVar1 = false;
            lVar9 = -10;
            local_14c = maxstars;
            do {
              bVar5 = pbVar8[-1];
              maxstars = local_14c;
              if (bVar1) break;
              iVar2 = Curl_islower((uint)bVar5);
              maxstars = local_14c;
              if (iVar2 == 0) {
                bVar1 = true;
                if (bVar5 != 0x3a) break;
              }
              else {
                abStack_15e[lVar9] = bVar5;
                bVar1 = false;
              }
              pbVar8 = pbVar8 + 1;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0);
          }
          local_158 = pbVar4 + 1;
          local_ed = 1;
          local_ed = 1;
          break;
        case 0x5c:
          local_158 = pbVar4 + 1;
          if (pbVar4[1] == 0) {
            local_ec = 1;
          }
          else {
LAB_001255d5:
            setcharorrange(&local_158,local_148);
          }
          break;
        case 0x5d:
          if (!bVar1) {
            local_eb = 1;
            local_158 = pbVar4 + 1;
            bVar1 = true;
            iVar2 = 1;
            goto LAB_001257b1;
          }
          goto LAB_001257f5;
        case 0x5e:
          goto switchD_001254eb_caseD_5e;
        default:
          if (bVar5 != 0x21) goto LAB_001255d5;
          goto switchD_001254eb_caseD_5e;
        }
        bVar1 = true;
LAB_001257af:
        iVar2 = 0;
LAB_001257b1:
        bVar5 = *local_158;
        pbVar4 = local_158;
        if (bVar5 == 0) {
          return 1;
        }
      }
      if (bVar5 == 0x5b) {
        local_ed = 1;
        local_158 = pbVar4 + 1;
        iVar2 = 2;
        goto LAB_001257b1;
      }
      if (bVar5 != 0x5d) {
        iVar2 = Curl_isprint((uint)bVar5);
        if (iVar2 == 0) {
          return 1;
        }
        local_148[bVar5] = '\x01';
        goto LAB_00125609;
      }
LAB_001257f5:
      bVar5 = *string;
      if (bVar5 == 0) {
        return 1;
      }
      uVar3 = 1;
      if (local_148[bVar5] == '\0') {
        uVar3 = (uint)bVar5;
        if (local_47 == '\0') {
          if (local_44 == '\0') {
            if (local_46 == '\0') {
              if (local_45 == '\0') {
                if (local_43 == '\0') {
                  if (local_3f == '\0') {
                    if (local_3e == '\0') {
                      if (local_41 == '\0') {
                        if (local_42 == '\0') {
                          if (local_40 == '\0') {
                            uVar3 = 0;
                          }
                          else {
                            uVar3 = Curl_isgraph(uVar3);
                          }
                        }
                        else {
                          uVar3 = (uint)(uVar3 == 9 || uVar3 == 0x20);
                        }
                      }
                      else {
                        uVar3 = Curl_islower(uVar3);
                      }
                    }
                    else {
                      uVar3 = Curl_isupper(uVar3);
                    }
                  }
                  else {
                    uVar3 = Curl_isspace(uVar3);
                  }
                }
                else {
                  uVar3 = Curl_isprint(uVar3);
                }
              }
              else {
                uVar3 = Curl_isxdigit(uVar3);
              }
            }
            else {
              uVar3 = Curl_isdigit(uVar3);
            }
          }
          else {
            uVar3 = Curl_isalpha(uVar3);
          }
        }
        else {
          uVar3 = Curl_isalnum(uVar3);
        }
      }
      uVar6 = (uint)(uVar3 == 0);
      if (local_48 == '\0') {
        uVar6 = uVar3;
      }
      if (uVar6 == 0) {
        return 1;
      }
      pattern = pbVar4 + 1;
    }
    else {
      if (bVar5 != 0x5c) goto LAB_001257e1;
      pbVar4 = pattern + 1;
      bVar5 = pattern[1];
      if (pattern[1] == 0) {
        pbVar4 = pattern;
        bVar5 = 0x5c;
      }
      if (*string != bVar5) {
        return 1;
      }
      pattern = pbVar4 + 1;
    }
    string = string + 1;
  } while( true );
switchD_001254eb_caseD_5e:
  if (bVar1) {
    puVar7 = local_148 + bVar5;
  }
  else {
    puVar7 = &local_48;
    if (local_48 != '\0') {
      puVar7 = local_148 + bVar5;
      bVar1 = true;
    }
  }
  *puVar7 = '\x01';
LAB_00125609:
  local_158 = pbVar4 + 1;
  goto LAB_001257af;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string,
                int maxstars)
{
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };

  for(;;) {
    unsigned char *pp;

    switch(*p) {
    case '*':
      if(!maxstars)
        return CURL_FNMATCH_NOMATCH;
      /* Regroup consecutive stars and question marks. This can be done because
         '*?*?*' can be expressed as '??*'. */
      for(;;) {
        if(*++p == '\0')
          return CURL_FNMATCH_MATCH;
        if(*p == '?') {
          if(!*s++)
            return CURL_FNMATCH_NOMATCH;
        }
        else if(*p != '*')
          break;
      }
      /* Skip string characters until we find a match with pattern suffix. */
      for(maxstars--; *s; s++) {
        if(loop(p, s, maxstars) == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
      }
      return CURL_FNMATCH_NOMATCH;
    case '?':
      if(!*s)
        return CURL_FNMATCH_NOMATCH;
      s++;
      p++;
      break;
    case '\0':
      return *s? CURL_FNMATCH_NOMATCH: CURL_FNMATCH_MATCH;
    case '\\':
      if(p[1])
        p++;
      if(*s++ != *p++)
        return CURL_FNMATCH_NOMATCH;
      break;
    case '[':
      pp = p + 1; /* Copy in case of syntax error in set. */
      if(setcharset(&pp, charset)) {
        int found = FALSE;
        if(!*s)
          return CURL_FNMATCH_NOMATCH;
        if(charset[(unsigned int)*s])
          found = TRUE;
        else if(charset[CURLFNM_ALNUM])
          found = ISALNUM(*s);
        else if(charset[CURLFNM_ALPHA])
          found = ISALPHA(*s);
        else if(charset[CURLFNM_DIGIT])
          found = ISDIGIT(*s);
        else if(charset[CURLFNM_XDIGIT])
          found = ISXDIGIT(*s);
        else if(charset[CURLFNM_PRINT])
          found = ISPRINT(*s);
        else if(charset[CURLFNM_SPACE])
          found = ISSPACE(*s);
        else if(charset[CURLFNM_UPPER])
          found = ISUPPER(*s);
        else if(charset[CURLFNM_LOWER])
          found = ISLOWER(*s);
        else if(charset[CURLFNM_BLANK])
          found = ISBLANK(*s);
        else if(charset[CURLFNM_GRAPH])
          found = ISGRAPH(*s);

        if(charset[CURLFNM_NEGATE])
          found = !found;

        if(!found)
          return CURL_FNMATCH_NOMATCH;
        p = pp + 1;
        s++;
        break;
      }
      /* Syntax error in set; mismatch! */
      return CURL_FNMATCH_NOMATCH;

    default:
      if(*p++ != *s++)
        return CURL_FNMATCH_NOMATCH;
      break;
    }
  }
}